

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O0

void __thiscall
spdlog::details::source_location_formatter::source_location_formatter
          (source_location_formatter *this,padding_info padinfo)

{
  padding_info padinfo_00;
  source_location_formatter *this_local;
  padding_info padinfo_local;
  
  padinfo_00._12_4_ = 0;
  padinfo_00.width_ = SUB128(padinfo._0_12_,0);
  padinfo_00.side_ = SUB124(padinfo._0_12_,8);
  flag_formatter::flag_formatter(&this->super_flag_formatter,padinfo_00);
  (this->super_flag_formatter)._vptr_flag_formatter =
       (_func_int **)&PTR__source_location_formatter_003a4698;
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, fmt::memory_buffer &dest) override
    {
        if (msg.source.empty())
        {
            return;
        }
        if (padinfo_.enabled())
        {
            const auto text_size = std::char_traits<char>::length(msg.source.filename) + fmt_helper::count_digits(msg.source.line) + 1;
            scoped_pad p(text_size, padinfo_, dest);
            fmt_helper::append_string_view(msg.source.filename, dest);
            dest.push_back(':');
            fmt_helper::append_int(msg.source.line, dest);
        }
        else
        {
            fmt_helper::append_string_view(msg.source.filename, dest);
            dest.push_back(':');
            fmt_helper::append_int(msg.source.line, dest);
        }
    }